

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

void mkcavearea(boolean rockit)

{
  undefined1 *puVar1;
  bool bVar2;
  level *plVar3;
  char cVar4;
  long lVar5;
  xchar y;
  long lVar6;
  xchar xVar7;
  char cVar8;
  int iVar9;
  char *pcVar10;
  byte bVar11;
  uint uVar12;
  ulong in_R8;
  xchar x;
  xchar y_00;
  
  y_00 = u.uy;
  x = u.ux;
  lVar5 = (long)u.ux;
  lVar6 = (long)u.uy;
  if ((level->locations[lVar5][lVar6].typ == '\x19') &&
     ((level->locations[lVar5][lVar6].field_0x7 & 8) != 0)) {
LAB_00167a8f:
    bVar11 = 1;
    bVar2 = false;
  }
  else {
    bVar11 = u.ux - 2;
    in_R8 = (ulong)(uint)(int)(char)bVar11;
    bVar2 = true;
    if ((int)(char)bVar11 < u.ux + 3) {
      uVar12 = (int)u.uy + 2;
      in_R8 = (ulong)uVar12;
      do {
        if ((int)(char)(u.uy + -1) < (int)uVar12) {
          xVar7 = u.uy;
          do {
            if (((byte)(xVar7 - 1U) < 0x15 && (byte)(bVar11 - 1) < 0x4f) &&
               ((level->locations[bVar11][(byte)(xVar7 - 1U)].field_0x7 & 8) != 0))
            goto LAB_00167a8f;
            iVar9 = (int)xVar7;
            xVar7 = xVar7 + '\x01';
          } while (iVar9 < (int)uVar12);
        }
        bVar11 = bVar11 + 1;
      } while ((int)(char)bVar11 < u.ux + 3);
    }
    bVar11 = 0;
  }
  if (rockit == '\0') {
    pcVar10 = "extends the";
    if (level->locations[lVar5][lVar6].typ == '\x18') {
      pcVar10 = "creates a";
    }
    pline("A mysterious force %s cave around you!",pcVar10);
  }
  else {
    pline("Crash!  The ceiling collapses around you!");
  }
  (*windowprocs.win_pause)(P_MESSAGE);
  iVar9 = 1;
  cVar4 = '\x01';
  uVar12 = (uint)bVar11;
  xVar7 = x;
  y = y_00;
  do {
    x = x + '\x01';
    if (iVar9 != 2) {
      y = y + -1;
      y_00 = y_00 + '\x01';
      if (xVar7 < x) {
        cVar8 = '\0';
        do {
          mkcavepos(xVar7 + cVar8,y,uVar12,rockit,(boolean)in_R8);
          mkcavepos(xVar7 + cVar8,y_00,(uint)bVar11,rockit,(boolean)in_R8);
          cVar8 = cVar8 + '\x01';
        } while (cVar4 != cVar8);
      }
    }
    xVar7 = xVar7 + -1;
    for (cVar8 = y; cVar8 <= y_00; cVar8 = cVar8 + '\x01') {
      mkcavepos(xVar7,cVar8,uVar12,rockit,(boolean)in_R8);
      mkcavepos(x,cVar8,uVar12,rockit,(boolean)in_R8);
    }
    flush_screen();
    (*windowprocs.win_delay)();
    plVar3 = level;
    iVar9 = iVar9 + 1;
    cVar4 = cVar4 + '\x02';
  } while (iVar9 != 3);
  if (rockit == '\0') {
    lVar5 = (long)u.ux;
    lVar6 = (long)u.uy;
    if (level->locations[lVar5][lVar6].typ == '\x18') {
      level->locations[lVar5][lVar6].typ = '\x19';
      if (!bVar2) {
        puVar1 = &plVar3->locations[lVar5][lVar6].field_0x7;
        *puVar1 = *puVar1 | 8;
      }
      newsym((int)u.ux,(int)u.uy);
    }
  }
  vision_full_recalc = '\x01';
  return;
}

Assistant:

static void mkcavearea(boolean rockit)
{
    int dist;
    xchar xmin = u.ux, xmax = u.ux;
    xchar ymin = u.uy, ymax = u.uy;
    xchar i;
    boolean waslit = rm_waslit();

    if (rockit) pline("Crash!  The ceiling collapses around you!");
    else pline("A mysterious force %s cave around you!",
	     (level->locations[u.ux][u.uy].typ == CORR) ? "creates a" : "extends the");
    win_pause_output(P_MESSAGE);

    for (dist = 1; dist <= 2; dist++) {
	xmin--; xmax++;

	/* top and bottom */
	if (dist < 2) { /* the area is wider that it is high */
	    ymin--; ymax++;
	    for (i = xmin+1; i < xmax; i++) {
		mkcavepos(i, ymin, dist, waslit, rockit);
		mkcavepos(i, ymax, dist, waslit, rockit);
	    }
	}

	/* left and right */
	for (i = ymin; i <= ymax; i++) {
	    mkcavepos(xmin, i, dist, waslit, rockit);
	    mkcavepos(xmax, i, dist, waslit, rockit);
	}

	flush_screen();	/* make sure the new glyphs shows up */
	win_delay_output();
    }

    if (!rockit && level->locations[u.ux][u.uy].typ == CORR) {
	level->locations[u.ux][u.uy].typ = ROOM;
	if (waslit) level->locations[u.ux][u.uy].waslit = TRUE;
	newsym(u.ux, u.uy); /* in case player is invisible */
    }

    vision_full_recalc = 1;	/* everything changed */
}